

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

int Fx_ManDivNormalize(Vec_Int_t *vCubeFree)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int Lit;
  uint uVar9;
  uint *puVar10;
  uint *puVar11;
  uint *local_38;
  
  if (vCubeFree->nSize != 4) {
    __assert_fail("Vec_IntSize(vCubeFree) == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                  ,0x233,"int Fx_ManDivNormalize(Vec_Int_t *)");
  }
  puVar2 = (uint *)vCubeFree->pArray;
  iVar3 = Abc_LitIsCompl(*puVar2);
  local_38 = puVar2 + 1;
  iVar4 = Abc_LitIsCompl(puVar2[1]);
  if ((iVar3 == iVar4) || (3 < (*puVar2 ^ puVar2[1]))) {
    iVar3 = Abc_LitIsCompl(puVar2[1]);
    puVar10 = puVar2 + 2;
    iVar4 = Abc_LitIsCompl(puVar2[2]);
    if ((iVar3 == iVar4) || (3 < (*local_38 ^ puVar2[2]))) {
      iVar3 = Abc_LitIsCompl(puVar2[2]);
      iVar4 = Abc_LitIsCompl(puVar2[3]);
      if (iVar3 == iVar4) {
        return -1;
      }
      puVar11 = puVar2 + 3;
      if (3 < (*puVar11 ^ *puVar10)) {
        return -1;
      }
      iVar3 = Abc_LitIsCompl(*puVar2);
      iVar4 = Abc_LitIsCompl(puVar2[1]);
      if (iVar3 == iVar4) {
        return -1;
      }
    }
    else {
      iVar3 = Abc_LitIsCompl(*puVar2);
      iVar4 = Abc_LitIsCompl(puVar2[3]);
      if (iVar3 == iVar4) {
        return -1;
      }
      puVar11 = puVar10;
      puVar10 = local_38;
      local_38 = puVar2 + 3;
    }
    iVar4 = Abc_Lit2Var(*puVar10);
    iVar3 = Abc_Lit2Var(*puVar11);
    iVar5 = Abc_LitIsCompl(*puVar10);
    iVar6 = Abc_LitIsCompl(*puVar2);
    puVar10 = puVar2;
    if (iVar5 != iVar6) {
      puVar10 = local_38;
      local_38 = puVar2;
    }
  }
  else {
    iVar3 = Abc_LitIsCompl(puVar2[2]);
    iVar4 = Abc_LitIsCompl(puVar2[3]);
    if (iVar3 == iVar4) {
      return -1;
    }
    puVar11 = puVar2 + 2;
    puVar1 = puVar2 + 3;
    iVar4 = Abc_Lit2Var(*puVar2);
    iVar3 = Abc_Lit2Var(puVar2[1]);
    iVar5 = Abc_LitIsCompl(*puVar2);
    iVar6 = Abc_LitIsCompl(puVar2[2]);
    if (iVar5 == iVar6) {
      iVar5 = Abc_LitIsCompl(*local_38);
      iVar6 = Abc_LitIsCompl(*puVar1);
      puVar10 = puVar11;
      local_38 = puVar1;
      if (iVar5 != iVar6) {
        __assert_fail("Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[3])",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                      ,0x23b,"int Fx_ManDivNormalize(Vec_Int_t *)");
      }
    }
    else {
      iVar5 = Abc_LitIsCompl(*puVar2);
      iVar6 = Abc_LitIsCompl(puVar2[3]);
      if (iVar5 != iVar6) {
        __assert_fail("Abc_LitIsCompl(L[0]) == Abc_LitIsCompl(L[3])",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                      ,0x240,"int Fx_ManDivNormalize(Vec_Int_t *)");
      }
      iVar5 = Abc_LitIsCompl(*local_38);
      iVar6 = Abc_LitIsCompl(*puVar11);
      puVar10 = puVar1;
      local_38 = puVar11;
      if (iVar5 != iVar6) {
        __assert_fail("Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[2])",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                      ,0x241,"int Fx_ManDivNormalize(Vec_Int_t *)");
      }
    }
  }
  iVar5 = Abc_Lit2Var(*puVar10);
  iVar6 = Abc_Lit2Var(*local_38);
  iVar7 = Abc_LitNot(iVar3);
  if (iVar4 != iVar7) {
    __assert_fail("LitA0 == Abc_LitNot(LitB0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                  ,0x25b,"int Fx_ManDivNormalize(Vec_Int_t *)");
  }
  iVar8 = Abc_LitIsCompl(iVar4);
  Lit = iVar6;
  iVar7 = iVar4;
  if (iVar8 != 0) {
    Lit = iVar5;
    iVar5 = iVar6;
    iVar7 = iVar3;
    iVar3 = iVar4;
  }
  iVar4 = Abc_LitIsCompl(iVar7);
  if (iVar4 != 0) {
    __assert_fail("!Abc_LitIsCompl(LitA0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                  ,0x261,"int Fx_ManDivNormalize(Vec_Int_t *)");
  }
  iVar4 = Abc_LitIsCompl(iVar5);
  if (iVar4 != 0) {
    iVar5 = Abc_LitNot(iVar5);
    Lit = Abc_LitNot(Lit);
  }
  iVar6 = Abc_LitIsCompl(iVar5);
  if (iVar6 != 0) {
    __assert_fail("!Abc_LitIsCompl(LitA1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                  ,0x268,"int Fx_ManDivNormalize(Vec_Int_t *)");
  }
  uVar9 = Abc_Var2Lit(iVar7,0);
  *puVar2 = uVar9;
  uVar9 = Abc_Var2Lit(iVar3,1);
  puVar2[1] = uVar9;
  uVar9 = Abc_Var2Lit(iVar5,0);
  puVar2[2] = uVar9;
  uVar9 = Abc_Var2Lit(Lit,1);
  puVar2[3] = uVar9;
  return (uint)(iVar4 != 0);
}

Assistant:

static int Fx_ManDivNormalize( Vec_Int_t * vCubeFree ) // return 1 if complemented
{
    int * L = Vec_IntArray(vCubeFree);
    int RetValue = 0, LitA0 = -1, LitB0 = -1, LitA1 = -1, LitB1 = -1;
    assert( Vec_IntSize(vCubeFree) == 4 );
    if ( Abc_LitIsCompl(L[0]) != Abc_LitIsCompl(L[1]) && (L[0] >> 2) == (L[1] >> 2) ) // diff cubes, same vars
    {
        if ( Abc_LitIsCompl(L[2]) == Abc_LitIsCompl(L[3]) )
            return -1;
        LitA0 = Abc_Lit2Var(L[0]), LitB0 = Abc_Lit2Var(L[1]);
        if ( Abc_LitIsCompl(L[0]) == Abc_LitIsCompl(L[2]) )
        {
            assert( Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[3]) );
            LitA1 = Abc_Lit2Var(L[2]), LitB1 = Abc_Lit2Var(L[3]);
        }
        else
        {
            assert( Abc_LitIsCompl(L[0]) == Abc_LitIsCompl(L[3]) );
            assert( Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[2]) );
            LitA1 = Abc_Lit2Var(L[3]), LitB1 = Abc_Lit2Var(L[2]);
        }
    }
    else if ( Abc_LitIsCompl(L[1]) != Abc_LitIsCompl(L[2]) && (L[1] >> 2) == (L[2] >> 2) )
    {
        if ( Abc_LitIsCompl(L[0]) == Abc_LitIsCompl(L[3]) )
            return -1;
        LitA0 = Abc_Lit2Var(L[1]), LitB0 = Abc_Lit2Var(L[2]);
        if ( Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[0]) )
            LitA1 = Abc_Lit2Var(L[0]), LitB1 = Abc_Lit2Var(L[3]);
        else
            LitA1 = Abc_Lit2Var(L[3]), LitB1 = Abc_Lit2Var(L[0]);
    }
    else if ( Abc_LitIsCompl(L[2]) != Abc_LitIsCompl(L[3]) && (L[2] >> 2) == (L[3] >> 2) )
    {
        if ( Abc_LitIsCompl(L[0]) == Abc_LitIsCompl(L[1]) )
            return -1;
        LitA0 = Abc_Lit2Var(L[2]), LitB0 = Abc_Lit2Var(L[3]);
        if ( Abc_LitIsCompl(L[2]) == Abc_LitIsCompl(L[0]) )
            LitA1 = Abc_Lit2Var(L[0]), LitB1 = Abc_Lit2Var(L[1]);
        else
            LitA1 = Abc_Lit2Var(L[1]), LitB1 = Abc_Lit2Var(L[0]);
    }
    else 
        return -1;
    assert( LitA0 == Abc_LitNot(LitB0) );
    if ( Abc_LitIsCompl(LitA0) )
    {
        ABC_SWAP( int, LitA0, LitB0 );
        ABC_SWAP( int, LitA1, LitB1 );
    }
    assert( !Abc_LitIsCompl(LitA0) );
    if ( Abc_LitIsCompl(LitA1) )
    {
        LitA1 = Abc_LitNot(LitA1);
        LitB1 = Abc_LitNot(LitB1);
        RetValue = 1;
    }
    assert( !Abc_LitIsCompl(LitA1) );
    // arrange literals in such as a way that
    // - the first two literals are control literals from different cubes
    // - the third literal is non-complented data input
    // - the forth literal is possibly complemented data input
    L[0] = Abc_Var2Lit( LitA0, 0 );
    L[1] = Abc_Var2Lit( LitB0, 1 );
    L[2] = Abc_Var2Lit( LitA1, 0 );
    L[3] = Abc_Var2Lit( LitB1, 1 );
    return RetValue;
}